

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O3

void __thiscall ycqian::thread_pool::~thread_pool(thread_pool *this)

{
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = (pthread_mutex_t *)
            (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      uVar2 = std::__throw_system_error(iVar1);
      __clang_call_terminate(uVar2);
    }
    ((this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->shutdown = true;
    pthread_mutex_unlock(__mutex);
    std::condition_variable::notify_all();
  }
  this_00 = (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~thread_pool(){
            if (data_) {
                {
                    std::lock_guard<std::mutex> lg(data_->mutex);
                    data_->shutdown = true;
                }
                data_->cv.notify_all();
            }
        }